

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O0

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessGSOutStreamOperations
          (ConversionStream *this,iterator *Token,String *OutStreamName,char *EntryPoint)

{
  bool bVar1;
  __type _Var2;
  pointer pHVar3;
  Char *Message;
  String local_130;
  undefined1 local_110 [8];
  string err_2;
  String local_e8;
  undefined1 local_c8 [8];
  string err_1;
  undefined1 local_88 [8];
  string err;
  _Self local_60;
  int local_58;
  int BraceCount;
  undefined1 local_48 [8];
  string msg;
  char *EntryPoint_local;
  String *OutStreamName_local;
  iterator *Token_local;
  ConversionStream *this_local;
  
  msg.field_2._8_8_ = EntryPoint;
  pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
  if (pHVar3->Type != OpenBrace) {
    FormatString<char[26],char[36]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Token->Type == TokenType::OpenBrace",(char (*) [36])EntryPoint);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"ProcessGSOutStreamOperations",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xff6);
    std::__cxx11::string::~string((string *)local_48);
  }
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
  local_58 = 1;
  do {
    while( true ) {
      local_60._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
           ::end(&this->m_Tokens);
      bVar1 = std::operator!=(Token,&local_60);
      if (!bVar1) {
        return;
      }
      pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
      if (pHVar3->Type == OpenBrace) {
        local_58 = local_58 + 1;
      }
      else {
        pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
        if ((pHVar3->Type == ClosingBrace) && (local_58 = local_58 + -1, local_58 == 0)) {
          return;
        }
      }
      pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
      if (pHVar3->Type == Identifier) break;
LAB_002ac376:
      std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
    }
    pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
    _Var2 = std::operator==(&pHVar3->Literal,OutStreamName);
    if (!_Var2) goto LAB_002ac376;
    std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
    err.field_2._8_8_ =
         std::__cxx11::
         list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
         end(&this->m_Tokens);
    bVar1 = std::operator!=(Token,(_Self *)((long)&err.field_2 + 8));
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      FormatString<char[15]>((string *)local_88,(char (*) [15])"Unexpected EOF");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                ((String *)((long)&err_1.field_2 + 8),this,Token,4);
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessGSOutStreamOperations",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x100c,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_88,(char (*) [2])0x46b1a3,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&err_1.field_2 + 8));
      std::__cxx11::string::~string((string *)(err_1.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_88);
    }
    pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
    bVar1 = std::operator==(&pHVar3->Literal,".");
    if (!bVar1) {
      FormatString<char[13]>((string *)local_c8,(char (*) [13])"\'.\' expected");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_e8,this,Token,4);
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessGSOutStreamOperations",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x100d,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c8,(char (*) [2])0x46b1a3,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)local_c8);
    }
    pHVar3 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
    std::__cxx11::string::operator=((string *)&pHVar3->Literal,"_");
    std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
    std::__cxx11::string::clear();
    std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
    err_2.field_2._8_8_ =
         std::__cxx11::
         list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
         end(&this->m_Tokens);
    bVar1 = std::operator!=(Token,(_Self *)((long)&err_2.field_2 + 8));
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      FormatString<char[15]>((string *)local_110,(char (*) [15])"Unexpected EOF");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_130,this,Token,4);
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessGSOutStreamOperations",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x1015,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_110,(char (*) [2])0x46b1a3,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)local_110);
    }
    std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
    std::__cxx11::string::clear();
    std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
  } while( true );
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessGSOutStreamOperations(TokenListType::iterator& Token, const String& OutStreamName, const char* EntryPoint)
{
    VERIFY_EXPR(Token->Type == TokenType::OpenBrace);

    ++Token; // Skip open brace
    int BraceCount = 1;
    // Find matching closing brace
    while (Token != m_Tokens.end())
    {
        if (Token->Type == TokenType::OpenBrace)
            ++BraceCount;
        else if (Token->Type == TokenType::ClosingBrace)
        {
            --BraceCount;
            if (BraceCount == 0)
                break;
        }
        if (Token->Type == TokenType::Identifier && Token->Literal == OutStreamName)
        {
            // triStream.Append( Out );
            // ^
            ++Token;
            // triStream.Append( Out );
            //          ^
            VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF");
            VERIFY_PARSER_STATE(Token, Token->Literal == ".", "\'.\' expected");
            Token->Literal = "_";
            Token->Delimiter.clear();
            // triStream_Append( Out );
            //          ^
            ++Token;
            // triStream_Append( Out );
            //           ^
            VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF");
            Token->Delimiter.clear();
            ++Token;
        }
        else
            ++Token;
    }
}